

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PostScript.cxx
# Opt level: O1

void __thiscall
Fl_PostScript_Graphics_Driver::Fl_PostScript_Graphics_Driver(Fl_PostScript_Graphics_Driver *this)

{
  Fl_Graphics_Driver::Fl_Graphics_Driver(&this->super_Fl_Graphics_Driver);
  (this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device =
       (_func_int **)&PTR_class_name_0027b150;
  this->close_cmd_ = (Fl_PostScript_Close_Command *)0x0;
  this->lang_level_ = 2;
  this->mask = (uchar *)0x0;
  this->ps_filename_ = (char *)0x0;
  this->scale_x = 1.0;
  this->scale_y = 1.0;
  this->bg_b = 0xff;
  this->bg_r = 0xff;
  this->bg_g = 0xff;
  return;
}

Assistant:

Fl_PostScript_Graphics_Driver::Fl_PostScript_Graphics_Driver(void)
{
  close_cmd_ = 0;
  //lang_level_ = 3;
  lang_level_ = 2;
  mask = 0;
  ps_filename_ = NULL;
  scale_x = scale_y = 1.;
  bg_r = bg_g = bg_b = 255;
}